

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-train.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ggml_opt_dataset_t dataset;
  int iVar2;
  char *__s;
  allocator<char> local_13a;
  allocator<char> local_139;
  string local_138;
  string local_118;
  mnist_model model;
  
  if (0xfffffffd < argc - 7U) {
    dataset = (ggml_opt_dataset_t)ggml_opt_dataset_init(0x310,10,60000);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&model,argv[3],(allocator<char> *)&local_138);
    bVar1 = mnist_image_load(&model.arch,dataset);
    std::__cxx11::string::~string((string *)&model);
    iVar2 = 1;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&model,argv[4],(allocator<char> *)&local_138);
      bVar1 = mnist_label_load(&model.arch,dataset);
      std::__cxx11::string::~string((string *)&model);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,argv[1],&local_139);
        if ((uint)argc < 6) {
          __s = "";
        }
        else {
          __s = argv[5];
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,__s,&local_13a);
        mnist_model_init_random(&model,&local_138,&local_118,1000,500);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        mnist_model_build(&model);
        mnist_model_train(&model,dataset,0x1e,0.05);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,argv[2],(allocator<char> *)&local_118);
        mnist_model_save(&model,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        mnist_model::~mnist_model(&model);
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  fprintf(_stderr,
          "Usage: %s mnist-fc mnist-fc-f32.gguf data/MNIST/raw/train-images-idx3-ubyte data/MNIST/raw/train-labels-idx1-ubyte [CPU/CUDA0]\n"
          ,*argv);
  exit(0);
}

Assistant:

int main(int argc, char ** argv) {
    if (argc != 5 && argc != 6) {
        fprintf(stderr, "Usage: %s mnist-fc mnist-fc-f32.gguf data/MNIST/raw/train-images-idx3-ubyte data/MNIST/raw/train-labels-idx1-ubyte [CPU/CUDA0]\n", argv[0]);
        exit(0);
    }

    // The MNIST model is so small that the overhead from data shuffling is non-negligible, especially with CUDA.
    // With a shard size of 10 this overhead is greatly reduced at the cost of less shuffling (does not seem to have a significant impact).
    // A batch of 500 images then consists of 50 random shards of size 10 instead of 500 random shards of size 1.
    ggml_opt_dataset_t dataset = ggml_opt_dataset_init(MNIST_NINPUT, MNIST_NCLASSES, MNIST_NTRAIN, /*ndata_shard =*/ 10);

    if (!mnist_image_load(argv[3], dataset)) {
        return 1;
    }
    if (!mnist_label_load(argv[4], dataset)) {
        return 1;
    }

    mnist_model model = mnist_model_init_random(argv[1], argc >= 6 ? argv[5] : "", MNIST_NBATCH_LOGICAL, MNIST_NBATCH_PHYSICAL);

    mnist_model_build(model);

    mnist_model_train(model, dataset, /*nepoch =*/ 30, /*val_split =*/ 0.05f);

    mnist_model_save(model, argv[2]);
}